

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

void FAudio_GetProcessingQuantum
               (FAudio *audio,uint32_t *quantumNumerator,uint32_t *quantumDenominator)

{
  code *pcVar1;
  int iVar2;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  SDL_AssertState sdl_assert_state;
  
  do {
    if (*(long *)(in_RDI + 0x10) != 0) goto LAB_001276f4;
    iVar2 = SDL_ReportAssertion(&FAudio_GetProcessingQuantum::sdl_assert_data,
                                "FAudio_GetProcessingQuantum",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                ,0x3ed);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
LAB_001276f4:
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = *(undefined4 *)(in_RDI + 0xc);
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0xdc);
  }
  return;
}

Assistant:

void FAudio_GetProcessingQuantum(
	FAudio *audio,
	uint32_t *quantumNumerator,
	uint32_t *quantumDenominator
) {
	FAudio_assert(audio->master != NULL);
	if (quantumNumerator != NULL)
	{
		*quantumNumerator = audio->updateSize;
	}
	if (quantumDenominator != NULL)
	{
		*quantumDenominator = audio->master->master.inputSampleRate;
	}
}